

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O3

void __thiscall QPDF::resolveObjectsInStream(QPDF *this,int obj_stream_number)

{
  _Base_ptr p_Var1;
  char cVar2;
  long lVar3;
  size_t *psVar4;
  __index_type _Var5;
  bool bVar6;
  int iVar7;
  _Base_ptr p_Var8;
  variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar9;
  mapped_type *pmVar10;
  Members *pMVar11;
  long *plVar12;
  QPDFObjGen *pQVar13;
  qpdf_offset_t qVar14;
  iterator iVar15;
  QPDFExc *pQVar16;
  __uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_> *p_Var17;
  uint uVar18;
  _Base_ptr p_Var19;
  element_type *peVar20;
  ulong *puVar21;
  ulong uVar22;
  long *plVar23;
  ulong *puVar24;
  ulong uVar25;
  __uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_> _Var26;
  ulong uVar27;
  size_type *psVar28;
  uint uVar29;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var30;
  size_t *psVar31;
  undefined8 uVar32;
  QPDFObjGen QVar33;
  uint uVar34;
  OffsetBuffer *pOVar35;
  uint uVar36;
  QPDFObjGen og;
  Buffer obj_buffer;
  int first;
  string __str;
  int id;
  uint n;
  Token tnum;
  Token toffset;
  string __str_1;
  QPDFObjectHandle dict;
  anon_class_16_2_1298170d damaged;
  vector<std::tuple<int,_long_long,_unsigned_long>,_std::allocator<std::tuple<int,_long_long,_unsigned_long>_>_>
  offsets;
  shared_ptr<Buffer> bp;
  QPDFObjGen stream_og;
  OffsetBuffer in;
  BufferInputSource input;
  uint local_4fc;
  string local_4f8;
  string local_4d8;
  OffsetBuffer *local_4b8;
  int local_4ac;
  string local_4a8;
  uint local_484;
  uint local_480;
  uint local_47c;
  ulong local_478;
  undefined1 local_470 [16];
  undefined1 local_460 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_438;
  _Alloc_hider local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  Stream local_408;
  size_t local_3f0;
  qpdf_offset_t local_3e8;
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  _Alloc_hider local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_378;
  long local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  string local_358;
  size_t *local_338;
  size_t *psStack_330;
  long local_328;
  long *local_320;
  long local_318;
  long local_310;
  long lStack_308;
  Stream local_300;
  QPDFObjGen local_2f0 [2];
  QPDFObjGen local_2e0;
  uchar *local_2d0;
  qpdf_offset_t local_2c8;
  qpdf_offset_t local_2c0;
  key_type local_2b8;
  undefined1 local_2b0 [168];
  BufferInputSource local_208;
  undefined1 local_118 [232];
  
  _Var30._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  p_Var8 = *(_Base_ptr *)((long)&(_Var30._M_head_impl)->resolved_object_streams + 0x10);
  if (p_Var8 != (_Base_ptr)0x0) {
    p_Var1 = (_Base_ptr)((long)&(_Var30._M_head_impl)->resolved_object_streams + 8);
    p_Var19 = p_Var1;
    do {
      if (obj_stream_number <= (int)p_Var8[1]._M_color) {
        p_Var19 = p_Var8;
      }
      p_Var8 = *(_Base_ptr *)
                ((long)&p_Var8->_M_left + (ulong)((int)p_Var8[1]._M_color < obj_stream_number) * 8);
    } while (p_Var8 != (_Base_ptr)0x0);
    if ((p_Var19 != p_Var1) && ((int)p_Var19[1]._M_color <= obj_stream_number)) {
      return;
    }
  }
  local_4fc = obj_stream_number;
  local_358.field_2._M_allocated_capacity = (size_type)this;
  local_358.field_2._8_4_ = obj_stream_number;
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
             &(_Var30._M_head_impl)->resolved_object_streams,(int *)&local_4fc);
  local_4b8 = (OffsetBuffer *)this;
  getObject((QPDF *)local_2b0,(int)this,local_4fc);
  if ((Members *)local_2b0._0_8_ != (Members *)0x0) {
    _Var5 = (__index_type)(((Tokenizer *)(local_2b0._0_8_ + 0x18))->val)._M_string_length;
    if (_Var5 == '\x0f') {
      pvVar9 = std::
               get<15ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                         ((variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           *)local_2b0._0_8_);
LAB_0022e396:
      _Var5 = *(__index_type *)
               ((long)&(((pvVar9->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->value).
                       super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       .
                       super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       .
                       super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       .
                       super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               + 0x30);
    }
    else if (_Var5 == '\r') {
      pvVar9 = (variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
                *)resolve((QPDF *)(((Tokenizer *)(local_2b0._0_8_ + 0x18))->raw_val)._M_dataplus.
                                  _M_p,
                          (QPDFObjGen)
                          (((Tokenizer *)(local_2b0._0_8_ + 0x18))->raw_val)._M_string_length);
      goto LAB_0022e396;
    }
    if (_Var5 == '\n') {
      local_408.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_2b0._0_8_;
      local_408.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_2b0._8_8_ + 8) = *(_Atomic_word *)(local_2b0._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_2b0._8_8_ + 8) = *(_Atomic_word *)(local_2b0._8_8_ + 8) + 1;
        }
      }
      goto LAB_0022e3e5;
    }
  }
  local_408.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_408.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_0022e3e5:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0._8_8_);
  }
  pOVar35 = local_4b8;
  if ((Members *)
      local_408.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (Members *)0x0) {
    pQVar16 = (QPDFExc *)__cxa_allocate_exception(0x80);
    std::__cxx11::to_string((string *)local_470,local_4fc);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                   "object ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_470);
    p_Var17 = (__uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_> *)
              std::__cxx11::string::append(local_118);
    local_2b0._0_8_ = p_Var17->_M_t;
    _Var26._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
    super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl =
         (tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_>)(p_Var17 + 2);
    if ((tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_>)local_2b0._0_8_ ==
        (_Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>)
        _Var26._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
        super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl) {
      local_2b0._16_8_ =
           *(undefined8 *)
            _Var26._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
            .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      local_2b0._24_8_ = p_Var17[3]._M_t;
      local_2b0._0_8_ = (long)local_2b0 + 0x10;
    }
    else {
      local_2b0._16_8_ =
           *(undefined8 *)
            _Var26._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
            .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    }
    local_2b0._8_8_ = p_Var17[1]._M_t;
    p_Var17->_M_t =
         _Var26._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    p_Var17[1]._M_t = (tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_>)0x0;
    *(undefined1 *)&p_Var17[2]._M_t = 0;
    std::__cxx11::to_string(&local_4d8,local_4fc);
    std::operator+(&local_4f8,"supposed object stream ",&local_4d8);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_4f8);
    local_3e0._0_8_ = *plVar12;
    peVar20 = (element_type *)(plVar12 + 2);
    if ((element_type *)local_3e0._0_8_ == peVar20) {
      local_3d0._0_8_ =
           *(undefined8 *)
            &(peVar20->value).
             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
      ;
      local_3d0._8_8_ = plVar12[3];
      local_3e0._0_8_ = (element_type *)local_3d0;
    }
    else {
      local_3d0._0_8_ =
           *(undefined8 *)
            &(peVar20->value).
             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
      ;
    }
    local_3e0._8_8_ = plVar12[1];
    *plVar12 = (long)peVar20;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    damagedPDF(pQVar16,(QPDF *)local_4b8,(string *)local_2b0,(string *)local_3e0);
    __cxa_throw(pQVar16,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  local_2b8.obj = local_4fc;
  local_2b8.gen = 0;
  pmVar10 = std::
            map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
            ::operator[](&((((__uniq_ptr_data<QPDF::Members,_std::default_delete<QPDF::Members>,_true,_true>
                              *)&(local_4b8->super_InputSource)._vptr_InputSource)->
                           super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                           )._M_t.
                           super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                           .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->obj_cache,
                         &local_2b8);
  local_2c0 = pmVar10->end_before_space;
  pmVar10 = std::
            map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
            ::operator[](&((((__uniq_ptr_data<QPDF::Members,_std::default_delete<QPDF::Members>,_true,_true>
                              *)&(pOVar35->super_InputSource)._vptr_InputSource)->
                           super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                           )._M_t.
                           super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                           .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->obj_cache,
                         &local_2b8);
  local_2c8 = pmVar10->end_after_space;
  pMVar11 = ::qpdf::Stream::stream(&local_408);
  pOVar35 = local_4b8;
  local_358._M_dataplus._M_p =
       (pointer)(pMVar11->stream_dict).super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_358._M_string_length =
       (size_type)
       (pMVar11->stream_dict).super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_358._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_358._M_string_length)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_358._M_string_length)->
           _M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_358._M_string_length)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_358._M_string_length)->
           _M_use_count + 1;
    }
  }
  local_2b0._8_8_ = 7;
  local_2b0._16_8_ = 0x6d74536a624f2f;
  puVar24 = (ulong *)(local_118 + 0x10);
  local_118._8_8_ = 0;
  local_118._16_8_ = local_118._16_8_ & 0xffffffffffffff00;
  local_2b0._0_8_ = (long)local_2b0 + 0x10;
  local_118._0_8_ = puVar24;
  bVar6 = QPDFObjectHandle::isDictionaryOfType
                    ((QPDFObjectHandle *)&local_358,(string *)local_2b0,(string *)local_118);
  if ((ulong *)local_118._0_8_ != puVar24) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  if (local_2b0._0_8_ != (long)local_2b0 + 0x10) {
    operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
  }
  if (!bVar6) {
    uVar29 = -local_4fc;
    if (0 < (int)local_4fc) {
      uVar29 = local_4fc;
    }
    uVar36 = 1;
    if (9 < uVar29) {
      uVar27 = (ulong)uVar29;
      uVar34 = 4;
      do {
        uVar36 = uVar34;
        uVar18 = (uint)uVar27;
        if (uVar18 < 100) {
          uVar36 = uVar36 - 2;
          goto LAB_0022e5ab;
        }
        if (uVar18 < 1000) {
          uVar36 = uVar36 - 1;
          goto LAB_0022e5ab;
        }
        if (uVar18 < 10000) goto LAB_0022e5ab;
        uVar27 = uVar27 / 10000;
        uVar34 = uVar36 + 4;
      } while (99999 < uVar18);
      uVar36 = uVar36 + 1;
    }
LAB_0022e5ab:
    uVar34 = local_4fc >> 0x1f;
    local_3e0._0_8_ = local_3d0;
    std::__cxx11::string::_M_construct
              ((ulong)local_3e0,(char)uVar36 - (char)((int)local_4fc >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)(local_3e0._0_8_ + (ulong)uVar34),uVar36,uVar29);
    plVar12 = (long *)std::__cxx11::string::replace((ulong)local_3e0,0,(char *)0x0,0x279462);
    local_470._0_8_ = local_460;
    peVar20 = (element_type *)(plVar12 + 2);
    if ((element_type *)*plVar12 == peVar20) {
      local_460._0_8_ =
           *(undefined8 *)
            &(peVar20->value).
             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
      ;
      local_460._8_8_ = plVar12[3];
    }
    else {
      local_460._0_8_ =
           *(undefined8 *)
            &(peVar20->value).
             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
      ;
      local_470._0_8_ = (element_type *)*plVar12;
    }
    local_470._8_8_ = plVar12[1];
    *plVar12 = (long)peVar20;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append(local_470);
    puVar21 = (ulong *)(plVar12 + 2);
    if ((ulong *)*plVar12 == puVar21) {
      local_118._16_8_ = *puVar21;
      local_118._24_8_ = plVar12[3];
      local_118._0_8_ = puVar24;
    }
    else {
      local_118._16_8_ = *puVar21;
      local_118._0_8_ = (ulong *)*plVar12;
    }
    local_118._8_8_ = plVar12[1];
    *plVar12 = (long)puVar21;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    uVar29 = -local_4fc;
    if (0 < (int)local_4fc) {
      uVar29 = local_4fc;
    }
    uVar36 = 1;
    if (9 < uVar29) {
      uVar27 = (ulong)uVar29;
      uVar34 = 4;
      do {
        uVar36 = uVar34;
        uVar18 = (uint)uVar27;
        if (uVar18 < 100) {
          uVar36 = uVar36 - 2;
          goto LAB_0022e715;
        }
        if (uVar18 < 1000) {
          uVar36 = uVar36 - 1;
          goto LAB_0022e715;
        }
        if (uVar18 < 10000) goto LAB_0022e715;
        uVar27 = uVar27 / 10000;
        uVar34 = uVar36 + 4;
      } while (99999 < uVar18);
      uVar36 = uVar36 + 1;
    }
LAB_0022e715:
    uVar34 = local_4fc >> 0x1f;
    local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
    std::__cxx11::string::_M_construct
              ((ulong)&local_4a8,(char)uVar36 - (char)((int)local_4fc >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_4a8._M_dataplus._M_p + uVar34,uVar36,uVar29);
    pQVar13 = (QPDFObjGen *)std::__cxx11::string::replace((ulong)&local_4a8,0,(char *)0x0,0x28000d);
    QVar33 = (QPDFObjGen)(pQVar13 + 2);
    if (*pQVar13 == QVar33) {
      local_4d8.field_2._M_allocated_capacity = *(undefined8 *)QVar33;
      local_4d8.field_2._8_8_ = pQVar13[3];
      local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
    }
    else {
      local_4d8.field_2._M_allocated_capacity = *(undefined8 *)QVar33;
      local_4d8._M_dataplus._M_p = (pointer)*pQVar13;
    }
    local_4d8._M_string_length = *(size_type *)(pQVar13 + 1);
    *pQVar13 = QVar33;
    pQVar13[1].obj = 0;
    pQVar13[1].gen = 0;
    *(undefined1 *)&pQVar13[2].obj = 0;
    pQVar13 = (QPDFObjGen *)std::__cxx11::string::append((char *)&local_4d8);
    pOVar35 = local_4b8;
    QVar33 = (QPDFObjGen)(pQVar13 + 2);
    if (*pQVar13 == QVar33) {
      local_4f8.field_2._M_allocated_capacity = *(undefined8 *)QVar33;
      local_4f8.field_2._8_8_ = pQVar13[3];
      local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
    }
    else {
      local_4f8.field_2._M_allocated_capacity = *(undefined8 *)QVar33;
      local_4f8._M_dataplus._M_p = (pointer)*pQVar13;
    }
    local_4f8._M_string_length = *(size_type *)(pQVar13 + 1);
    *pQVar13 = QVar33;
    pQVar13[1].obj = 0;
    pQVar13[1].gen = 0;
    *(undefined1 *)&pQVar13[2].obj = 0;
    damagedPDF((QPDFExc *)local_2b0,(QPDF *)local_4b8,(string *)local_118,&local_4f8);
    warn((QPDF *)pOVar35,(QPDFExc *)local_2b0);
    QPDFExc::~QPDFExc((QPDFExc *)local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
      operator_delete(local_4f8._M_dataplus._M_p,
                      (ulong)(local_4f8.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
      operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
    }
    pOVar35 = local_4b8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
      operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
    }
    if ((ulong *)local_118._0_8_ != puVar24) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
    if ((element_type *)local_470._0_8_ != (element_type *)local_460) {
      operator_delete((void *)local_470._0_8_,local_460._0_8_ + 1);
    }
    if ((element_type *)local_3e0._0_8_ != (element_type *)local_3d0) {
      operator_delete((void *)local_3e0._0_8_,local_3d0._0_8_ + 1);
    }
  }
  _Var30._M_head_impl = (Members *)(local_2b0 + 0x10);
  local_47c = 0;
  local_4ac = 0;
  local_2b0._8_8_ = 2;
  local_2b0._16_3_ = 0x4e2f;
  local_2b0._0_8_ = _Var30._M_head_impl;
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_470,&local_358);
  bVar6 = QPDFObjectHandle::getValueAsUInt((QPDFObjectHandle *)local_470,&local_47c);
  if (bVar6) {
    local_118._8_8_ = 6;
    local_118._16_7_ = 0x74737269462f;
    local_118._0_8_ = puVar24;
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_3e0,&local_358);
    bVar6 = QPDFObjectHandle::getValueAsInt((QPDFObjectHandle *)local_3e0,&local_4ac);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3e0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3e0._8_8_);
    }
    if ((ulong *)local_118._0_8_ != puVar24) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
  }
  else {
    bVar6 = false;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_470._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_470._8_8_);
  }
  if ((Members *)local_2b0._0_8_ != _Var30._M_head_impl) {
    operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
  }
  if (bVar6 == false) {
    pQVar16 = (QPDFExc *)__cxa_allocate_exception(0x80);
    std::__cxx11::to_string((string *)local_470,local_4fc);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                   "object ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_470);
    p_Var17 = (__uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_> *)
              std::__cxx11::string::append(local_118);
    local_2b0._0_8_ = p_Var17->_M_t;
    _Var26._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
    super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl =
         (tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_>)(p_Var17 + 2);
    if ((tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_>)local_2b0._0_8_ ==
        (_Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>)
        _Var26._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
        super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl) {
      local_2b0._16_8_ =
           *(undefined8 *)
            _Var26._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
            .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      local_2b0._24_8_ = p_Var17[3]._M_t;
      local_2b0._0_8_ = (long)local_2b0 + 0x10;
    }
    else {
      local_2b0._16_8_ =
           *(undefined8 *)
            _Var26._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
            .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    }
    local_2b0._8_8_ = p_Var17[1]._M_t;
    p_Var17->_M_t =
         _Var26._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    p_Var17[1]._M_t = (tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_>)0x0;
    *(undefined1 *)&p_Var17[2]._M_t = 0;
    std::__cxx11::to_string(&local_4d8,local_4fc);
    std::operator+(&local_4f8,"object stream ",&local_4d8);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_4f8);
    local_3e0._0_8_ = *plVar12;
    peVar20 = (element_type *)(plVar12 + 2);
    if ((element_type *)local_3e0._0_8_ == peVar20) {
      local_3d0._0_8_ =
           *(undefined8 *)
            &(peVar20->value).
             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
      ;
      local_3d0._8_8_ = plVar12[3];
      local_3e0._0_8_ = (element_type *)local_3d0;
    }
    else {
      local_3d0._0_8_ =
           *(undefined8 *)
            &(peVar20->value).
             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
      ;
    }
    local_3e0._8_8_ = plVar12[1];
    *plVar12 = (long)peVar20;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    damagedPDF(pQVar16,(QPDF *)local_4b8,(string *)local_2b0,(string *)local_3e0);
    __cxa_throw(pQVar16,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  local_338 = (size_t *)0x0;
  psStack_330 = (size_t *)0x0;
  local_328 = 0;
  ::qpdf::Stream::getStreamData(&local_300,(qpdf_stream_decode_level_e)&local_408);
  local_2b0._8_8_ = 0;
  local_2b0._16_8_ = local_2b0._16_8_ & 0xffffffffffffff00;
  local_2b0._0_8_ = _Var30._M_head_impl;
  BufferInputSource::BufferInputSource
            ((BufferInputSource *)local_118,(string *)local_2b0,
             (Buffer *)
             local_300.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,false);
  if ((Members *)local_2b0._0_8_ != _Var30._M_head_impl) {
    operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
  }
  local_3f0 = Buffer::getSize((Buffer *)
                              local_300.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_2d0 = Buffer::getBuffer((Buffer *)
                                local_300.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if ((long)local_3f0 <= (long)local_4ac) {
    pQVar16 = (QPDFExc *)__cxa_allocate_exception(0x80);
    std::__cxx11::to_string((string *)local_3e0,local_4fc);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_470,
                   "object ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e0);
    p_Var17 = (__uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_> *)
              std::__cxx11::string::append(local_470);
    local_2b0._0_8_ = p_Var17->_M_t;
    _Var26._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
    super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl =
         (tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_>)(p_Var17 + 2);
    if ((tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_>)local_2b0._0_8_ ==
        (_Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>)
        _Var26._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
        super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl) {
      local_2b0._16_8_ =
           *(undefined8 *)
            _Var26._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
            .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      local_2b0._24_8_ = p_Var17[3]._M_t;
      local_2b0._0_8_ = (long)local_2b0 + 0x10;
    }
    else {
      local_2b0._16_8_ =
           *(undefined8 *)
            _Var26._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
            .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    }
    local_2b0._8_8_ = p_Var17[1]._M_t;
    p_Var17->_M_t =
         _Var26._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    p_Var17[1]._M_t = (tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_>)0x0;
    *(undefined1 *)&p_Var17[2]._M_t = 0;
    std::__cxx11::to_string(&local_4a8,local_4fc);
    std::operator+(&local_4d8,"object stream ",&local_4a8);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_4d8);
    local_4f8._M_dataplus._M_p = (pointer)*plVar12;
    psVar28 = (size_type *)(plVar12 + 2);
    if ((size_type *)local_4f8._M_dataplus._M_p == psVar28) {
      local_4f8.field_2._M_allocated_capacity = *psVar28;
      local_4f8.field_2._8_8_ = *(QPDFObjGen *)(plVar12 + 3);
      local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
    }
    else {
      local_4f8.field_2._M_allocated_capacity = *psVar28;
    }
    local_4f8._M_string_length = plVar12[1];
    *plVar12 = (long)psVar28;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    damagedPDF(pQVar16,(QPDF *)local_4b8,(string *)local_2b0,&local_4f8);
    __cxa_throw(pQVar16,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  local_480 = 0;
  if (local_47c != 0) {
    local_478 = 0xffffffffffffffff;
    local_484 = (uint)CONCAT71((int7)(int3)((uint)local_4ac >> 8),1);
    uVar29 = 0;
    do {
      _Var30._M_head_impl =
           (((__uniq_ptr_data<QPDF::Members,_std::default_delete<QPDF::Members>,_true,_true> *)
            &(pOVar35->super_InputSource)._vptr_InputSource)->
           super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>)._M_t.
           super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      ::qpdf::Tokenizer::readToken
                ((Token *)local_470,&(_Var30._M_head_impl)->tokenizer,(InputSource *)local_118,
                 &(_Var30._M_head_impl)->last_object_description,true,0);
      qVar14 = InputSource::getLastOffset((InputSource *)local_118);
      _Var30._M_head_impl =
           (((__uniq_ptr_data<QPDF::Members,_std::default_delete<QPDF::Members>,_true,_true> *)
            &(pOVar35->super_InputSource)._vptr_InputSource)->
           super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>)._M_t.
           super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      ::qpdf::Tokenizer::readToken
                ((Token *)local_3e0,&(_Var30._M_head_impl)->tokenizer,(InputSource *)local_118,
                 &(_Var30._M_head_impl)->last_object_description,true,0);
      if ((local_470._0_4_ != tt_integer) || (local_3e0._0_4_ != tt_integer)) {
        pQVar16 = (QPDFExc *)__cxa_allocate_exception(0x80);
        qVar14 = InputSource::getLastOffset((InputSource *)local_118);
        local_2b0._0_8_ = (long)local_2b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2b0,"expected integer in object stream header","");
        resolveObjectsInStream::anon_class_16_2_1298170d::operator()
                  (pQVar16,(anon_class_16_2_1298170d *)&local_358.field_2,0,qVar14,
                   (string *)local_2b0);
        __cxa_throw(pQVar16,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
      }
      uVar36 = QUtil::string_to_int((char *)local_470._8_8_);
      iVar7 = QUtil::string_to_int((char *)local_3e0._8_8_);
      if (uVar36 == local_4fc) {
        local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
        local_4d8._M_dataplus._M_p = (pointer)0x26;
        local_4f8._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_4f8,(ulong)&local_4d8);
        local_4f8.field_2._M_allocated_capacity = (size_type)local_4d8._M_dataplus._M_p;
        *(undefined8 *)((long)local_4f8._M_dataplus._M_p + 0x10) = 0x206f7420736d6961;
        *(undefined8 *)((long)local_4f8._M_dataplus._M_p + 0x18) = 0x206e6961746e6f63;
        *(undefined8 *)local_4f8._M_dataplus._M_p = 0x73207463656a626f;
        *(undefined8 *)((long)local_4f8._M_dataplus._M_p + 8) = 0x6c63206d61657274;
        builtin_strncpy((char *)((long)local_4f8._M_dataplus._M_p + 0x1e),"n itself",8);
        local_4f8._M_string_length = (size_type)local_4d8._M_dataplus._M_p;
        *(char *)((long)local_4f8._M_dataplus._M_p + (long)local_4d8._M_dataplus._M_p) = '\0';
        resolveObjectsInStream::anon_class_16_2_1298170d::operator()
                  ((QPDFExc *)local_2b0,(anon_class_16_2_1298170d *)&local_358.field_2,uVar36,qVar14
                   ,&local_4f8);
        warn((QPDF *)pOVar35,(QPDFExc *)local_2b0);
LAB_0022ed1e:
        QPDFExc::~QPDFExc((QPDFExc *)local_2b0);
        uVar32 = local_4f8.field_2._M_allocated_capacity;
        QVar33 = (QPDFObjGen)local_4f8._M_dataplus;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
LAB_0022ed3a:
          operator_delete((void *)QVar33,(ulong)(uVar32 + 1));
        }
      }
      else {
        if ((int)uVar36 < 1) {
          local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
          local_4d8._M_dataplus._M_p = (pointer)0x14;
          local_4f8._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_4f8,(ulong)&local_4d8);
          local_4f8.field_2._M_allocated_capacity = (size_type)local_4d8._M_dataplus._M_p;
          *(undefined8 *)local_4f8._M_dataplus._M_p = 0x69207463656a626f;
          *(undefined8 *)((long)local_4f8._M_dataplus._M_p + 8) = 0x766e692073692064;
          ((QPDFObjGen *)((long)local_4f8._M_dataplus._M_p + 0x10))->obj = 0x64696c61;
          local_4f8._M_string_length = (size_type)local_4d8._M_dataplus._M_p;
          *(char *)((long)local_4f8._M_dataplus._M_p + (long)local_4d8._M_dataplus._M_p) = '\0';
          resolveObjectsInStream::anon_class_16_2_1298170d::operator()
                    ((QPDFExc *)local_2b0,(anon_class_16_2_1298170d *)&local_358.field_2,uVar36,
                     qVar14,&local_4f8);
          warn((QPDF *)pOVar35,(QPDFExc *)local_2b0);
          goto LAB_0022ed1e;
        }
        uVar27 = (ulong)iVar7;
        cVar2 = (char)(iVar7 >> 0x1f);
        if ((QPDFObjGen)(uVar27 - local_478) == (QPDFObjGen)0x0 || (long)uVar27 < (long)local_478) {
          local_3e8 = InputSource::getLastOffset((InputSource *)local_118);
          uVar25 = -uVar27;
          if (0 < (long)uVar27) {
            uVar25 = uVar27;
          }
          uVar34 = 1;
          if (9 < uVar25) {
            uVar22 = uVar25;
            uVar18 = 4;
            do {
              uVar34 = uVar18;
              if (uVar22 < 100) {
                uVar34 = uVar34 - 2;
                goto LAB_0022ef45;
              }
              if (uVar22 < 1000) {
                uVar34 = uVar34 - 1;
                goto LAB_0022ef45;
              }
              if (uVar22 < 10000) goto LAB_0022ef45;
              bVar6 = 99999 < uVar22;
              uVar22 = uVar22 / 10000;
              uVar18 = uVar34 + 4;
            } while (bVar6);
            uVar34 = uVar34 + 1;
          }
LAB_0022ef45:
          local_2f0[0] = (QPDFObjGen)&local_2e0;
          std::__cxx11::string::_M_construct((ulong)local_2f0,(char)uVar34 - cVar2);
          std::__detail::__to_chars_10_impl<unsigned_long_long>
                    ((char *)((long)local_2f0[0] - ((long)uVar27 >> 0x3f)),uVar34,uVar25);
          plVar12 = (long *)std::__cxx11::string::replace((ulong)local_2f0,0,(char *)0x0,0x27feb3);
          local_320 = &local_310;
          plVar23 = plVar12 + 2;
          if ((long *)*plVar12 == plVar23) {
            local_310 = *plVar23;
            lStack_308 = plVar12[3];
          }
          else {
            local_310 = *plVar23;
            local_320 = (long *)*plVar12;
          }
          local_318 = plVar12[1];
          *plVar12 = (long)plVar23;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_320);
          puVar24 = (ulong *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar24) {
            local_4a8.field_2._M_allocated_capacity = *puVar24;
            local_4a8.field_2._8_8_ = plVar12[3];
            local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
          }
          else {
            local_4a8.field_2._M_allocated_capacity = *puVar24;
            local_4a8._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_4a8._M_string_length = plVar12[1];
          *plVar12 = (long)puVar24;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          uVar27 = -local_478;
          if (0 < (long)local_478) {
            uVar27 = local_478;
          }
          uVar34 = 1;
          if (9 < uVar27) {
            uVar25 = uVar27;
            uVar18 = 4;
            do {
              uVar34 = uVar18;
              if (uVar25 < 100) {
                uVar34 = uVar34 - 2;
                goto LAB_0022f0cb;
              }
              if (uVar25 < 1000) {
                uVar34 = uVar34 - 1;
                goto LAB_0022f0cb;
              }
              if (uVar25 < 10000) goto LAB_0022f0cb;
              bVar6 = 99999 < uVar25;
              uVar25 = uVar25 / 10000;
              uVar18 = uVar34 + 4;
            } while (bVar6);
            uVar34 = uVar34 + 1;
          }
LAB_0022f0cb:
          lVar3 = (long)local_478 >> 0x3f;
          local_378 = &local_368;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_378,(char)uVar34 - (char)((long)local_478 >> 0x3f));
          std::__detail::__to_chars_10_impl<unsigned_long_long>
                    ((char *)((long)local_378 - lVar3),uVar34,uVar27);
          pOVar35 = local_4b8;
          uVar32 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
            uVar32 = local_4a8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar32 < local_370 + local_4a8._M_string_length) {
            uVar32 = 0xf;
            if (local_378 != &local_368) {
              uVar32 = local_368._M_allocated_capacity;
            }
            if ((ulong)uVar32 < local_370 + local_4a8._M_string_length) goto LAB_0022f173;
            pQVar13 = (QPDFObjGen *)
                      std::__cxx11::string::replace
                                ((ulong)&local_378,0,(char *)0x0,(ulong)local_4a8._M_dataplus._M_p);
          }
          else {
LAB_0022f173:
            pQVar13 = (QPDFObjGen *)
                      std::__cxx11::string::_M_append((char *)&local_4a8,(ulong)local_378);
          }
          QVar33 = (QPDFObjGen)(pQVar13 + 2);
          if (*pQVar13 == QVar33) {
            local_4d8.field_2._M_allocated_capacity = *(undefined8 *)QVar33;
            local_4d8.field_2._8_8_ = pQVar13[3];
            local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
          }
          else {
            local_4d8.field_2._M_allocated_capacity = *(undefined8 *)QVar33;
            local_4d8._M_dataplus._M_p = (pointer)*pQVar13;
          }
          local_4d8._M_string_length = *(size_type *)(pQVar13 + 1);
          *pQVar13 = QVar33;
          pQVar13[1].obj = 0;
          pQVar13[1].gen = 0;
          *(undefined1 *)QVar33 = 0;
          pQVar13 = (QPDFObjGen *)std::__cxx11::string::append((char *)&local_4d8);
          local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
          QVar33 = (QPDFObjGen)(pQVar13 + 2);
          if (*pQVar13 == QVar33) {
            local_4f8.field_2._M_allocated_capacity = *(undefined8 *)QVar33;
            local_4f8.field_2._8_8_ = pQVar13[3];
          }
          else {
            local_4f8.field_2._M_allocated_capacity = *(undefined8 *)QVar33;
            local_4f8._M_dataplus._M_p = (pointer)*pQVar13;
          }
          local_4f8._M_string_length = *(size_type *)(pQVar13 + 1);
          *pQVar13 = QVar33;
          pQVar13[1].obj = 0;
          pQVar13[1].gen = 0;
          *(undefined1 *)&pQVar13[2].obj = 0;
          resolveObjectsInStream::anon_class_16_2_1298170d::operator()
                    ((QPDFExc *)local_2b0,(anon_class_16_2_1298170d *)&local_358.field_2,uVar36,
                     local_3e8,&local_4f8);
          warn((QPDF *)pOVar35,(QPDFExc *)local_2b0);
          QPDFExc::~QPDFExc((QPDFExc *)local_2b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
            operator_delete(local_4f8._M_dataplus._M_p,
                            (ulong)(local_4f8.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
            operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
          }
          if (local_378 != &local_368) {
            operator_delete(local_378,local_368._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
            operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
          }
          if (local_320 != &local_310) {
            operator_delete(local_320,local_310 + 1);
          }
          uVar32 = local_2e0;
          QVar33 = local_2f0[0];
          if (local_2f0[0] == (QPDFObjGen)&local_2e0) goto LAB_0022ed42;
          goto LAB_0022ed3a;
        }
        if ((int)uVar36 <=
            ((((__uniq_ptr_data<QPDF::Members,_std::default_delete<QPDF::Members>,_true,_true> *)
              &(pOVar35->super_InputSource)._vptr_InputSource)->
             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>)._M_t.
             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
             super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->xref_table_max_id) {
          if ((long)((long)local_4ac + uVar27) < (long)local_3f0) {
            if ((local_484 & 1) == 0) {
              local_2b0._0_8_ = local_478 + (long)local_4ac;
              local_4f8._M_dataplus._M_p = (pointer)(uVar27 - local_478);
              std::
              vector<std::tuple<int,long_long,unsigned_long>,std::allocator<std::tuple<int,long_long,unsigned_long>>>
              ::emplace_back<int&,long_long,unsigned_long>
                        ((vector<std::tuple<int,long_long,unsigned_long>,std::allocator<std::tuple<int,long_long,unsigned_long>>>
                          *)&local_338,(int *)&local_480,(longlong *)local_2b0,
                         (unsigned_long *)&local_4f8);
              local_480 = uVar36;
              local_478 = uVar27;
            }
            else {
              local_484 = 0;
              local_480 = uVar36;
              local_478 = uVar27;
            }
          }
          else {
            local_3e8 = InputSource::getLastOffset((InputSource *)local_118);
            uVar25 = -uVar27;
            if (0 < (long)uVar27) {
              uVar25 = uVar27;
            }
            uVar34 = 1;
            if (9 < uVar25) {
              uVar22 = uVar25;
              uVar18 = 4;
              do {
                uVar34 = uVar18;
                if (uVar22 < 100) {
                  uVar34 = uVar34 - 2;
                  goto LAB_0022f38a;
                }
                if (uVar22 < 1000) {
                  uVar34 = uVar34 - 1;
                  goto LAB_0022f38a;
                }
                if (uVar22 < 10000) goto LAB_0022f38a;
                bVar6 = 99999 < uVar22;
                uVar22 = uVar22 / 10000;
                uVar18 = uVar34 + 4;
              } while (bVar6);
              uVar34 = uVar34 + 1;
            }
LAB_0022f38a:
            local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
            std::__cxx11::string::_M_construct((ulong)&local_4a8,(char)uVar34 - cVar2);
            std::__detail::__to_chars_10_impl<unsigned_long_long>
                      (local_4a8._M_dataplus._M_p + -((long)uVar27 >> 0x3f),uVar34,uVar25);
            pQVar13 = (QPDFObjGen *)
                      std::__cxx11::string::replace((ulong)&local_4a8,0,(char *)0x0,0x27feb3);
            pOVar35 = local_4b8;
            QVar33 = (QPDFObjGen)(pQVar13 + 2);
            if (*pQVar13 == QVar33) {
              local_4d8.field_2._M_allocated_capacity = *(undefined8 *)QVar33;
              local_4d8.field_2._8_8_ = pQVar13[3];
              local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
            }
            else {
              local_4d8.field_2._M_allocated_capacity = *(undefined8 *)QVar33;
              local_4d8._M_dataplus._M_p = (pointer)*pQVar13;
            }
            local_4d8._M_string_length = *(size_type *)(pQVar13 + 1);
            *pQVar13 = QVar33;
            pQVar13[1].obj = 0;
            pQVar13[1].gen = 0;
            *(undefined1 *)&pQVar13[2].obj = 0;
            pQVar13 = (QPDFObjGen *)std::__cxx11::string::append((char *)&local_4d8);
            local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
            QVar33 = (QPDFObjGen)(pQVar13 + 2);
            if (*pQVar13 == QVar33) {
              local_4f8.field_2._M_allocated_capacity = *(undefined8 *)QVar33;
              local_4f8.field_2._8_8_ = pQVar13[3];
            }
            else {
              local_4f8.field_2._M_allocated_capacity = *(undefined8 *)QVar33;
              local_4f8._M_dataplus._M_p = (pointer)*pQVar13;
            }
            local_4f8._M_string_length = *(size_type *)(pQVar13 + 1);
            *pQVar13 = QVar33;
            pQVar13[1].obj = 0;
            pQVar13[1].gen = 0;
            *(undefined1 *)&pQVar13[2].obj = 0;
            resolveObjectsInStream::anon_class_16_2_1298170d::operator()
                      ((QPDFExc *)local_2b0,(anon_class_16_2_1298170d *)&local_358.field_2,uVar36,
                       local_3e8,&local_4f8);
            warn((QPDF *)pOVar35,(QPDFExc *)local_2b0);
            QPDFExc::~QPDFExc((QPDFExc *)local_2b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
              operator_delete(local_4f8._M_dataplus._M_p,
                              (ulong)(local_4f8.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
              operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
              operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
      }
LAB_0022ed42:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_p != &local_388) {
        operator_delete(local_398._M_p,local_388._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._24_8_ != &local_3a8) {
        operator_delete((void *)local_3d0._24_8_,local_3a8._M_allocated_capacity + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3e0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_3d0 + 8)) {
        operator_delete((void *)local_3e0._8_8_,local_3d0._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_p != &local_418) {
        operator_delete(local_428._M_p,local_418._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._24_8_ != &local_438) {
        operator_delete((void *)local_460._24_8_,local_438._M_allocated_capacity + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_470._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_460 + 8)) {
        operator_delete((void *)local_470._8_8_,local_460._8_8_ + 1);
      }
      uVar29 = uVar29 + 1;
    } while (uVar29 < local_47c);
    if ((local_484 & 1) == 0) {
      local_2b0._0_8_ = local_478 + (long)local_4ac;
      local_470._0_8_ = local_3f0 - local_2b0._0_8_;
      std::
      vector<std::tuple<int,long_long,unsigned_long>,std::allocator<std::tuple<int,long_long,unsigned_long>>>
      ::emplace_back<int&,long_long,unsigned_long>
                ((vector<std::tuple<int,long_long,unsigned_long>,std::allocator<std::tuple<int,long_long,unsigned_long>>>
                  *)&local_338,(int *)&local_480,(longlong *)local_2b0,(unsigned_long *)local_470);
    }
  }
  psVar4 = psStack_330;
  if (local_338 != psStack_330) {
    psVar31 = local_338;
    do {
      local_4f8._M_dataplus._M_p._4_4_ = 0;
      local_4f8._M_dataplus._M_p._0_4_ = (uint)psVar31[2];
      iVar15 = std::
               _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFXRefEntry>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
               ::find(&(((((__uniq_ptr_data<QPDF::Members,_std::default_delete<QPDF::Members>,_true,_true>
                            *)&(pOVar35->super_InputSource)._vptr_InputSource)->
                         super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>).
                         _M_t.
                         super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                         .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->xref_table).
                       _M_t,(key_type *)&local_4f8);
      if (iVar15._M_node !=
          (_Base_ptr)
          ((long)&((((__uniq_ptr_data<QPDF::Members,_std::default_delete<QPDF::Members>,_true,_true>
                      *)&(pOVar35->super_InputSource)._vptr_InputSource)->
                   super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>)._M_t.
                   super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                   super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->xref_table + 8U)) {
        iVar7 = QPDFXRefEntry::getType((QPDFXRefEntry *)&iVar15._M_node[1]._M_parent);
        if ((iVar7 == 2) &&
           (uVar29 = QPDFXRefEntry::getObjStreamNumber
                               ((QPDFXRefEntry *)&iVar15._M_node[1]._M_parent), uVar29 == local_4fc)
           ) {
          Buffer::Buffer((Buffer *)&local_4d8,local_2d0 + psVar31[1],*psVar31);
          local_470._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_460._0_8_ = local_460._0_8_ & 0xffffffffffffff00;
          local_470._0_8_ = (element_type *)local_460;
          ::qpdf::is::OffsetBuffer::OffsetBuffer
                    ((OffsetBuffer *)local_2b0,(string *)local_470,(Buffer *)&local_4d8,psVar31[1]);
          pOVar35 = local_4b8;
          if ((element_type *)local_470._0_8_ != (element_type *)local_460) {
            operator_delete((void *)local_470._0_8_,local_460._0_8_ + 1);
          }
          readObjectInStream((QPDF *)local_470,pOVar35,(int)local_2b0,local_4fc);
          local_3e0._0_8_ = local_470._0_8_;
          local_3e0._8_8_ = local_470._8_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_470._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_470._8_8_ + 8) = *(_Atomic_word *)(local_470._8_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_470._8_8_ + 8) = *(_Atomic_word *)(local_470._8_8_ + 8) + 1;
            }
          }
          updateCache((QPDF *)pOVar35,(QPDFObjGen)local_4f8._M_dataplus._M_p,
                      (shared_ptr<QPDFObject> *)local_3e0,local_2c0,local_2c8,true);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3e0._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3e0._8_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_470._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_470._8_8_);
          }
          BufferInputSource::~BufferInputSource(&local_208);
          Buffer::~Buffer((Buffer *)&local_4d8);
        }
      }
      psVar31 = psVar31 + 3;
      pOVar35 = local_4b8;
    } while (psVar31 != psVar4);
  }
  BufferInputSource::~BufferInputSource((BufferInputSource *)local_118);
  if (local_300.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_300.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_338 != (size_t *)0x0) {
    operator_delete(local_338,local_328 - (long)local_338);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_358._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_358._M_string_length);
  }
  if (local_408.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_408.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return;
}

Assistant:

void
QPDF::resolveObjectsInStream(int obj_stream_number)
{
    auto damaged =
        [this, obj_stream_number](int id, qpdf_offset_t offset, std::string const& msg) -> QPDFExc {
        return {
            qpdf_e_damaged_pdf,
            m->file->getName() + " object stream " + std::to_string(obj_stream_number),
            +"object " + std::to_string(id) + " 0",
            offset,
            msg,
            true};
    };

    if (m->resolved_object_streams.count(obj_stream_number)) {
        return;
    }
    m->resolved_object_streams.insert(obj_stream_number);
    // Force resolution of object stream
    auto obj_stream = getObject(obj_stream_number, 0).as_stream();
    if (!obj_stream) {
        throw damagedPDF(
            "object " + std::to_string(obj_stream_number) + " 0",
            "supposed object stream " + std::to_string(obj_stream_number) + " is not a stream");
    }

    // For linearization data in the object, use the data from the object stream for the objects in
    // the stream.
    QPDFObjGen stream_og(obj_stream_number, 0);
    qpdf_offset_t end_before_space = m->obj_cache[stream_og].end_before_space;
    qpdf_offset_t end_after_space = m->obj_cache[stream_og].end_after_space;

    QPDFObjectHandle dict = obj_stream.getDict();
    if (!dict.isDictionaryOfType("/ObjStm")) {
        QTC::TC("qpdf", "QPDF ERR object stream with wrong type");
        warn(damagedPDF(
            "object " + std::to_string(obj_stream_number) + " 0",
            "supposed object stream " + std::to_string(obj_stream_number) + " has wrong type"));
    }

    unsigned int n{0};
    int first{0};
    if (!(dict.getKey("/N").getValueAsUInt(n) && dict.getKey("/First").getValueAsInt(first))) {
        throw damagedPDF(
            "object " + std::to_string(obj_stream_number) + " 0",
            "object stream " + std::to_string(obj_stream_number) + " has incorrect keys");
    }

    // id, offset, size
    std::vector<std::tuple<int, qpdf_offset_t, size_t>> offsets;

    auto bp = obj_stream.getStreamData(qpdf_dl_specialized);

    BufferInputSource input("", bp.get());

    const auto b_size = bp->getSize();
    const auto end_offset = static_cast<qpdf_offset_t>(b_size);
    auto b_start = bp->getBuffer();

    if (first >= end_offset) {
        throw damagedPDF(
            "object " + std::to_string(obj_stream_number) + " 0",
            "object stream " + std::to_string(obj_stream_number) + " has invalid /First entry");
    }

    int id = 0;
    long long last_offset = -1;
    bool is_first = true;
    for (unsigned int i = 0; i < n; ++i) {
        auto tnum = readToken(input);
        auto id_offset = input.getLastOffset();
        auto toffset = readToken(input);
        if (!(tnum.isInteger() && toffset.isInteger())) {
            throw damaged(0, input.getLastOffset(), "expected integer in object stream header");
        }

        int num = QUtil::string_to_int(tnum.getValue().c_str());
        long long offset = QUtil::string_to_int(toffset.getValue().c_str());

        if (num == obj_stream_number) {
            QTC::TC("qpdf", "QPDF ignore self-referential object stream");
            warn(damaged(num, id_offset, "object stream claims to contain itself"));
            continue;
        }

        if (num < 1) {
            QTC::TC("qpdf", "QPDF object stream contains id < 1");
            warn(damaged(num, id_offset, "object id is invalid"s));
            continue;
        }

        if (offset <= last_offset) {
            QTC::TC("qpdf", "QPDF object stream offsets not increasing");
            warn(damaged(
                num,
                input.getLastOffset(),
                "offset " + std::to_string(offset) +
                    " is invalid (must be larger than previous offset " +
                    std::to_string(last_offset) + ")"));
            continue;
        }

        if (num > m->xref_table_max_id) {
            continue;
        }

        if (first + offset >= end_offset) {
            warn(damaged(
                num, input.getLastOffset(), "offset " + std::to_string(offset) + " is too large"));
            continue;
        }

        if (is_first) {
            is_first = false;
        } else {
            offsets.emplace_back(
                id, last_offset + first, static_cast<size_t>(offset - last_offset));
        }

        last_offset = offset;
        id = num;
    }

    if (!is_first) {
        // We found at least one valid entry.
        offsets.emplace_back(
            id, last_offset + first, b_size - static_cast<size_t>(last_offset + first));
    }

    // To avoid having to read the object stream multiple times, store all objects that would be
    // found here in the cache.  Remember that some objects stored here might have been overridden
    // by new objects appended to the file, so it is necessary to recheck the xref table and only
    // cache what would actually be resolved here.
    for (auto const& [obj_id, obj_offset, obj_size]: offsets) {
        QPDFObjGen og(obj_id, 0);
        auto entry = m->xref_table.find(og);
        if (entry != m->xref_table.end() && entry->second.getType() == 2 &&
            entry->second.getObjStreamNumber() == obj_stream_number) {
            Buffer obj_buffer{b_start + obj_offset, obj_size};
            is::OffsetBuffer in("", &obj_buffer, obj_offset);
            auto oh = readObjectInStream(in, obj_stream_number, obj_id);
            updateCache(og, oh.getObj(), end_before_space, end_after_space);
        } else {
            QTC::TC("qpdf", "QPDF not caching overridden objstm object");
        }
    }
}